

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vpscatterdd(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  undefined8 uVar3;
  
  if (((pMyDisasm->Reserved_).EVEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01')) {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  (pMyDisasm->Instruction).Category = 0x140000;
  pcVar1 = (pMyDisasm->Instruction).Mnemonic;
  if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
    builtin_strncpy(pcVar1,"vpscatterdd",0xc);
    UVar2 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar2 == '\0') goto LAB_0012a96b;
    if (UVar2 == '\x01') {
      uVar3 = 0x800000008;
    }
    else {
      if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_0012a99e;
      uVar3 = 0x1000000010;
    }
  }
  else {
    builtin_strncpy(pcVar1,"vpscatterdq",0xc);
    UVar2 = (pMyDisasm->Reserved_).VEX.L;
    if (UVar2 == '\0') {
LAB_0012a96b:
      uVar3 = 0x400000004;
    }
    else if (UVar2 == '\x01') {
      uVar3 = 0x800000004;
    }
    else {
      if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') goto LAB_0012a99e;
      uVar3 = 0x1000000008;
    }
  }
  (pMyDisasm->Reserved_).VSIB_ = (int)uVar3;
  (pMyDisasm->Reserved_).Register_ = (int)((ulong)uVar3 >> 0x20);
LAB_0012a99e:
  (pMyDisasm->Reserved_).EVEX.masking = '\x01';
  (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
  (pMyDisasm->Reserved_).MemDecoration = 3;
  ExGx(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vpscatterdd(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpscatterdd");
        #endif
        if (GV.VEX.L == 0) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.VSIB_ = AVX_REG;
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.VSIB_ = AVX512_REG;
          GV.Register_ = AVX512_REG;
        }
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpscatterdq");
        #endif
        if (GV.VEX.L == 0) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          GV.VSIB_ = SSE_REG;
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          GV.VSIB_ = AVX_REG;
          GV.Register_ = AVX512_REG;
        }
      }
      GV.EVEX.masking = MERGING;
      GV.EVEX.tupletype = TUPLE1_SCALAR;
      GV.MemDecoration = Arg1dword;
      ExGx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}